

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O1

void Abc_SclDnsizePerform(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  Abc_Ntk_t *pNtk_00;
  
  pNtk_00 = pNtk;
  if (0 < pNtk->nBarBufs2) {
    pNtk_00 = Abc_NtkDupDfsNoBarBufs(pNtk);
  }
  Abc_SclDnsizePerformInt(pLib,pNtk_00,pPars);
  if (0 < pNtk->nBarBufs2) {
    Abc_SclTransferGates(pNtk,pNtk_00);
  }
  if (0 < pNtk->nBarBufs2) {
    Abc_NtkDelete(pNtk_00);
    return;
  }
  return;
}

Assistant:

void Abc_SclDnsizePerform( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    Abc_Ntk_t * pNtkNew = pNtk;
    if ( pNtk->nBarBufs2 > 0 )
        pNtkNew = Abc_NtkDupDfsNoBarBufs( pNtk );
    Abc_SclDnsizePerformInt( pLib, pNtkNew, pPars );
    if ( pNtk->nBarBufs2 > 0 )
        Abc_SclTransferGates( pNtk, pNtkNew );
    if ( pNtk->nBarBufs2 > 0 )
        Abc_NtkDelete( pNtkNew );
}